

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O3

void anon_unknown.dwarf_1574b9::fillPixels1(Array2D<Imf_3_2::Rgba> *pixels,int w,int h)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  int x;
  uint uVar6;
  ulong uVar7;
  ushort uVar8;
  undefined4 in_register_00000034;
  long lVar9;
  long lVar10;
  ushort uVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  
  lVar3 = _imath_half_to_float_table;
  lVar9 = CONCAT44(in_register_00000034,w) + 6;
  lVar10 = 0;
  do {
    fVar13 = (float)((uint)lVar10 & 1);
    uVar6 = (uint)fVar13 & 0x7fffff | 0x800000;
    cVar2 = (char)((uint)fVar13 >> 0x17);
    bVar1 = 0x7eU - cVar2 & 0x1f;
    uVar5 = (uint)fVar13 >> 0xd & 0x3ff;
    uVar4 = (ushort)uVar5 | 0x7c00 | (ushort)(uVar5 == 0);
    uVar11 = (ushort)(0x80000000 < uVar6 << (cVar2 + 0xa2U & 0x1f)) + (short)(uVar6 >> bVar1);
    uVar8 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd);
    if (0x477fefff < (uint)fVar13) {
      uVar8 = 0x7c00;
    }
    if (fVar13 == INFINITY) {
      uVar4 = 0x7c00;
    }
    if ((uint)fVar13 < 0x7f800000) {
      uVar4 = uVar8;
    }
    if ((uint)fVar13 < 0x33000001) {
      uVar11 = 0;
    }
    if (0x387fffff < (uint)fVar13) {
      uVar11 = uVar4;
    }
    uVar7 = (ulong)(0 >> bVar1);
    do {
      fVar13 = (float)((uint)uVar7 & 1);
      if ((uint)fVar13 < 0x38800000) {
        if ((uint)fVar13 < 0x33000001) {
          uVar8 = 0;
        }
        else {
          uVar5 = (uint)fVar13 & 0x7fffff | 0x800000;
          cVar2 = (char)((uint)fVar13 >> 0x17);
          uVar8 = (ushort)(uVar5 >> (0x7eU - cVar2 & 0x1f));
          if (0x80000000 < uVar5 << (cVar2 + 0xa2U & 0x1f)) {
            uVar8 = uVar8 + 1;
          }
        }
      }
      else if ((uint)fVar13 < 0x7f800000) {
        if ((uint)fVar13 < 0x477ff000) {
          uVar8 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd);
        }
        else {
          uVar8 = 0x7c00;
        }
      }
      else {
        uVar8 = 0x7c00;
        if (fVar13 != INFINITY) {
          uVar5 = (uint)fVar13 >> 0xd & 0x3ff;
          uVar8 = (ushort)(uVar5 == 0) | (ushort)uVar5 | 0x7c00;
        }
      }
      fVar13 = (float)((uint)lVar10 + (uint)uVar7 & 1);
      *(ushort *)(lVar9 + -6 + uVar7 * 8) = uVar8;
      if ((uint)fVar13 < 0x38800000) {
        if ((uint)fVar13 < 0x33000001) {
          uVar12 = 0;
        }
        else {
          uVar5 = (uint)fVar13 & 0x7fffff | 0x800000;
          cVar2 = (char)((uint)fVar13 >> 0x17);
          uVar6 = uVar5 >> (0x7eU - cVar2 & 0x1f);
          uVar12 = (ulong)uVar6;
          if (0x80000000 < uVar5 << (cVar2 + 0xa2U & 0x1f)) {
            uVar12 = (ulong)(uVar6 + 1);
          }
        }
      }
      else if ((uint)fVar13 < 0x7f800000) {
        if ((uint)fVar13 < 0x477ff000) {
          uVar12 = (ulong)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd);
        }
        else {
          uVar12 = 0x7c00;
        }
      }
      else {
        uVar12 = 0x7c00;
        if (fVar13 != INFINITY) {
          uVar5 = (uint)fVar13 >> 0xd & 0x3ff;
          uVar12 = (ulong)(uVar5 == 0 | uVar5 | 0x7c00);
        }
      }
      *(short *)(lVar9 + -4 + uVar7 * 8) = (short)uVar12;
      *(ushort *)(lVar9 + -2 + uVar7 * 8) = uVar11;
      fVar14 = (*(float *)(lVar3 + (ulong)uVar8 * 4) + *(float *)(lVar3 + (ulong)uVar11 * 4) +
               *(float *)(lVar3 + (uVar12 & 0xffff) * 4)) / 3.0;
      fVar13 = ABS(fVar14);
      uVar8 = (ushort)((uint)fVar14 >> 0x10) & 0x8000;
      if ((uint)fVar13 < 0x38800000) {
        if ((0x33000000 < (uint)fVar13) &&
           (cVar2 = (char)((uint)fVar13 >> 0x17), uVar5 = (uint)fVar13 & 0x7fffff | 0x800000,
           uVar8 = uVar8 | (ushort)(uVar5 >> (0x7eU - cVar2 & 0x1f)),
           0x80000000 < uVar5 << (cVar2 + 0xa2U & 0x1f))) {
          uVar8 = uVar8 + 1;
        }
      }
      else if ((uint)fVar13 < 0x7f800000) {
        if ((uint)fVar13 < 0x477ff000) {
          uVar8 = (ushort)((int)fVar13 + 0x8000fff + (uint)(((uint)fVar13 >> 0xd & 1) != 0) >> 0xd)
                  | uVar8;
        }
        else {
          uVar8 = uVar8 | 0x7c00;
        }
      }
      else {
        uVar8 = uVar8 | 0x7c00;
        if (fVar13 != INFINITY) {
          uVar5 = (uint)fVar13 >> 0xd & 0x3ff;
          uVar8 = uVar8 | (ushort)uVar5 | (ushort)(uVar5 == 0);
        }
      }
      *(ushort *)(lVar9 + uVar7 * 8) = uVar8;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x77);
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + (long)pixels * 8;
  } while (lVar10 != 0xed);
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba>& pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
        for (int x = 0; x < w; ++x)
        {
            Rgba& p = pixels[y][x];

            p.r = (x & 1);
            p.g = ((x + y) & 1);
            p.b = (y & 1);
            p.a = (p.r + p.b + p.g) / 3.0;
        }
    }
}